

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void benchmark_test(void)

{
  rpc_server server;
  string *in_stack_fffffffffffffbf8;
  rpc_server *this;
  allocator<char> local_3e1;
  string local_3e0 [240];
  size_t in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined2 in_stack_fffffffffffffd2e;
  undefined8 in_stack_fffffffffffffd30;
  
  std::thread::hardware_concurrency();
  rest_rpc::rpc_service::rpc_server::rpc_server
            ((rpc_server *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2e,
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  this = (rpc_server *)&local_3e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"echo",(allocator *)this);
  rest_rpc::rpc_service::rpc_server::
  register_handler<false,std::__cxx11::string(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (this,in_stack_fffffffffffffbf8,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)0x1bca47);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  rest_rpc::rpc_service::rpc_server::run((rpc_server *)0x1bca67);
  rest_rpc::rpc_service::rpc_server::~rpc_server(this);
  return;
}

Assistant:

void benchmark_test() {
  rpc_server server(9000, std::thread::hardware_concurrency());
  server.register_handler("echo", echo);
  server.run();
}